

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O0

_Bool check_hit(player *p,wchar_t to_hit)

{
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  _Bool _Var1;
  int iVar2;
  int local_18;
  wchar_t ac;
  wchar_t to_hit_local;
  player *p_local;
  
  local_18 = (p->state).ac + (p->state).to_a;
  if (character_dungeon) {
    grid.x = (p->grid).x;
    grid.y = (p->grid).y;
    _Var1 = square_isprotect((chunk *)cave,grid);
    if (_Var1) {
      grid_00.x = (p->grid).x;
      grid_00.y = (p->grid).y;
      _Var1 = square_isorganic((chunk *)cave,grid_00);
      if (_Var1) {
        _Var1 = flag_has_dbg((p->state).pflags,10,0x30,"p->state.pflags","(PF_WOODSMAN)");
        if ((_Var1) ||
           (_Var1 = flag_has_dbg((p->state).pflags,10,0x16,"p->state.pflags","(PF_ELVEN)"), _Var1))
        {
          iVar2 = local_18 / 8 + 10;
        }
        else {
          iVar2 = local_18 / 10 + 2;
        }
      }
      else {
        iVar2 = local_18 / 8 + 5;
      }
      local_18 = iVar2 + local_18;
    }
    grid_01.x = (p->grid).x;
    grid_01.y = (p->grid).y;
    _Var1 = square_isexpose((chunk *)cave,grid_01);
    if (_Var1) {
      local_18 = local_18 - local_18 / 3;
    }
  }
  equip_learn_on_defend(p);
  _Var1 = test_hit(to_hit,(local_18 * 3) / 4);
  return _Var1;
}

Assistant:

bool check_hit(struct player *p, int to_hit)
{
	int ac = p->state.ac + p->state.to_a;

	/* Players can take advantage of cover. */
	if (character_dungeon) {
		if (square_isprotect(cave, p->grid)) {
			/* Players in trees can take advantage of cover, especially elves, 
			 * rangers and druids. */
			if (square_isorganic(cave, p->grid)) {
				if (player_has(p, PF_WOODSMAN) || player_has(p, PF_ELVEN)) {
					ac += ac / 8 + 10;
				} else {
					ac += ac / 10 + 2;
				}
			} else {
				/* Players in rubble can take advantage of cover. */
				ac += ac / 8 + 5;
			}
		}

		/* Players can be vulnerable. */
		if (square_isexpose(cave, p->grid)) {
			ac -= ac / 3;
		}
	}

	/* If anything checks vs ac, the player learns ac bonuses */
	equip_learn_on_defend(p);

	/* Check if the player was hit */
	return test_hit(to_hit, (ac * 3) / 4);
}